

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
AnalyzeFunctionDefinition
          (ExpressionContext *ctx,SynFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *instance,TypeBase *instanceParent,IntrusiveList<MatchData> matches,
          bool createAccess,bool hideFunction,bool checkParent)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  TypeBase *pTVar4;
  ExprError *pEVar5;
  TypeBase *returnType;
  undefined4 extraout_var;
  ExprFunctionDefinition *definition;
  ExprBase *pEVar6;
  char *pcVar7;
  byte bVar8;
  ExpressionContext *this;
  uint uVar9;
  bool local_3e;
  
  if (instanceParent == (TypeBase *)0x0) {
    local_3e = hideFunction;
    bVar8 = 1;
    if (syntax->parentType != (SynBase *)0x0) {
      this = ctx;
      instanceParent = AnalyzeType(ctx,syntax->parentType,true,(bool *)0x0);
      pTVar4 = (TypeBase *)0x0;
      if (instanceParent == (TypeBase *)0x0) goto LAB_001689bd;
      uVar9 = instanceParent->typeID;
      if (uVar9 != 0) {
        if ((checkParent) &&
           (pTVar4 = ExpressionContext::GetCurrentType(this,ctx->scope), pTVar4 != (TypeBase *)0x0))
        {
          if (instanceParent != pTVar4) {
            pcVar7 = (instanceParent->name).begin;
            pcVar2 = (pTVar4->name).begin;
            anon_unknown.dwarf_b837c::Stop
                      (ctx,&syntax->super_SynBase,
                       "ERROR: cannot define class \'%.*s\' function inside the scope of class \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(instanceParent->name).end - (int)pcVar7),pcVar7,
                       (ulong)(uint)(*(int *)&(pTVar4->name).end - (int)pcVar2),pcVar2);
          }
          syntax = (SynFunctionDefinition *)syntax->parentType;
          pcVar7 = "ERROR: class name repeated inside the definition of class";
          goto LAB_00168aed;
        }
        goto LAB_001688c1;
      }
    }
    pTVar4 = (TypeBase *)0x0;
  }
  else {
    uVar9 = instanceParent->typeID;
LAB_001688c1:
    bVar8 = 0;
    pTVar4 = instanceParent;
    local_3e = hideFunction;
    if ((uVar9 < 0xf) && ((0x7002U >> (uVar9 & 0x1f) & 1) != 0)) {
      bVar1 = syntax->accessor;
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      if (bVar1 == true) {
        pcVar7 = "ERROR: cannot add accessor to type \'%.*s\'";
      }
      else {
        pcVar7 = "ERROR: cannot add member function to type \'%.*s\'";
      }
      pEVar5 = anon_unknown.dwarf_b837c::ReportExpected
                         (ctx,&syntax->super_SynBase,pTVar4,pcVar7,
                          (ulong)(uint)(*(int *)&(instanceParent->name).end -
                                       (int)(instanceParent->name).begin));
      return &pEVar5->super_ExprBase;
    }
  }
LAB_001689bd:
  returnType = AnalyzeType(ctx,syntax->returnType,true,(bool *)0x0);
  if (returnType->isGeneric != true) {
    if ((bVar8 & syntax->accessor) == 1) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      definition = (ExprFunctionDefinition *)CONCAT44(extraout_var,iVar3);
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError((ExprError *)definition,&syntax->super_SynBase,pTVar4);
    }
    else {
      definition = (ExprFunctionDefinition *)
                   CreateFunctionDefinition
                             (ctx,&syntax->super_SynBase,(bool)(syntax->super_SynBase).field_0x3a,
                              (bool)(syntax->super_SynBase).field_0x3b,pTVar4,syntax->accessor,
                              returnType,syntax->isOperator,syntax->name,syntax->aliases,
                              syntax->arguments,syntax->expressions,genericProto,instance,matches);
      if (definition == (ExprFunctionDefinition *)0x0) {
        definition = (ExprFunctionDefinition *)0x0;
      }
      else if (((definition->super_ExprBase).typeID == 0x24) &&
              (createAccess && definition->function->scope->ownerType == (TypeBase *)0x0)) {
        pEVar6 = CreateFunctionPointer(ctx,&syntax->super_SynBase,definition,local_3e);
        return pEVar6;
      }
    }
    return &definition->super_ExprBase;
  }
  pcVar7 = "ERROR: return type can\'t be generic";
LAB_00168aed:
  anon_unknown.dwarf_b837c::Stop(ctx,&syntax->super_SynBase,pcVar7);
}

Assistant:

ExprBase* AnalyzeFunctionDefinition(ExpressionContext &ctx, SynFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *instance, TypeBase *instanceParent, IntrusiveList<MatchData> matches, bool createAccess, bool hideFunction, bool checkParent)
{
	TypeBase *parentType = NULL;

	if(instanceParent)
	{
		parentType = instanceParent;
	}
	else if(syntax->parentType)
	{
		parentType = AnalyzeType(ctx, syntax->parentType);

		if(isType<TypeError>(parentType))
			parentType = NULL;

		if(parentType && checkParent)
		{
			if(TypeBase *currentType = ctx.GetCurrentType(ctx.scope))
			{
				if(parentType == currentType)
					Stop(ctx, syntax->parentType, "ERROR: class name repeated inside the definition of class");

				Stop(ctx, syntax, "ERROR: cannot define class '%.*s' function inside the scope of class '%.*s'", FMT_ISTR(parentType->name), FMT_ISTR(currentType->name));
			}
		}
	}

	if(parentType && (isType<TypeGeneric>(parentType) || isType<TypeGenericAlias>(parentType) || isType<TypeAuto>(parentType) || isType<TypeVoid>(parentType)))
	{
		if(syntax->accessor)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add accessor to type '%.*s'", FMT_ISTR(parentType->name));

		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add member function to type '%.*s'", FMT_ISTR(parentType->name));
	}

	TypeBase *returnType = AnalyzeType(ctx, syntax->returnType);

	if(returnType->isGeneric)
		Stop(ctx, syntax, "ERROR: return type can't be generic");

	if(syntax->accessor && !parentType)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	ExprBase *value = CreateFunctionDefinition(ctx, syntax, syntax->prototype, syntax->coroutine, parentType, syntax->accessor, returnType, syntax->isOperator, syntax->name, syntax->aliases, syntax->arguments, syntax->expressions, genericProto, instance, matches);

	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
	{
		if(definition->function->scope->ownerType)
			return value;

		if(createAccess)
			return CreateFunctionPointer(ctx, syntax, definition, hideFunction);
	}

	return value;
}